

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx512::BVHNIntersector1<8,_257,_false,_embree::avx512::VirtualCurveIntersector1>::
     intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  bool bVar3;
  undefined1 auVar4 [32];
  undefined8 uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [12];
  int iVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong *puVar13;
  ulong uVar14;
  ulong unaff_R15;
  byte bVar15;
  ulong uVar16;
  ulong uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [64];
  undefined4 uVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [64];
  undefined1 auVar38 [16];
  undefined1 auVar39 [64];
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  float fVar42;
  undefined1 auVar43 [32];
  vfloat4 a0;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [32];
  undefined1 auVar51 [16];
  undefined1 auVar52 [64];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  Precalculations pre;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  float local_2578 [4];
  undefined1 local_2568 [16];
  undefined1 local_2558 [16];
  undefined1 local_2548 [16];
  undefined1 local_2538 [8];
  float fStack_2530;
  float fStack_252c;
  float fStack_2528;
  float fStack_2524;
  float fStack_2520;
  undefined4 uStack_251c;
  undefined1 local_2518 [32];
  float local_24f8;
  float fStack_24f4;
  float fStack_24f0;
  float fStack_24ec;
  float fStack_24e8;
  float fStack_24e4;
  float fStack_24e0;
  float fStack_24dc;
  undefined4 local_24d8;
  undefined4 uStack_24d4;
  undefined4 uStack_24d0;
  undefined4 uStack_24cc;
  undefined4 uStack_24c8;
  undefined4 uStack_24c4;
  undefined4 uStack_24c0;
  undefined4 uStack_24bc;
  undefined4 local_24b8;
  undefined4 uStack_24b4;
  undefined4 uStack_24b0;
  undefined4 uStack_24ac;
  undefined4 uStack_24a8;
  undefined4 uStack_24a4;
  undefined4 uStack_24a0;
  undefined4 uStack_249c;
  undefined4 local_2498;
  undefined4 uStack_2494;
  undefined4 uStack_2490;
  undefined4 uStack_248c;
  undefined4 uStack_2488;
  undefined4 uStack_2484;
  undefined4 uStack_2480;
  undefined4 uStack_247c;
  undefined1 local_2478 [32];
  undefined1 local_2458 [32];
  undefined1 local_2438 [32];
  undefined1 local_2418 [32];
  undefined1 local_23f8 [32];
  undefined1 local_23d8 [32];
  undefined1 local_23b8 [32];
  undefined1 local_2398 [32];
  ulong local_2378;
  undefined4 local_2370;
  ulong local_2368 [1127];
  undefined1 auVar20 [16];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    aVar2 = (ray->super_RayK<1>).dir.field_0.field_1;
    auVar40 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
    auVar7 = ZEXT812(0) << 0x20;
    auVar36 = ZEXT816(0) << 0x40;
    auVar20._4_12_ = auVar7;
    auVar20._0_4_ = auVar40._0_4_;
    auVar18 = vrsqrt14ss_avx512f(auVar36,auVar20);
    fVar42 = auVar18._0_4_;
    local_2578[0] = fVar42 * 1.5 - auVar40._0_4_ * 0.5 * fVar42 * fVar42 * fVar42;
    local_24f8 = aVar2.x;
    auVar44._0_4_ = local_24f8 * local_2578[0];
    auVar44._4_4_ = aVar2.y * local_2578[0];
    auVar44._8_4_ = aVar2.z * local_2578[0];
    auVar44._12_4_ = aVar2.field_3.w * local_2578[0];
    auVar18 = vshufpd_avx(auVar44,auVar44,1);
    auVar40 = vmovshdup_avx(auVar44);
    auVar53._8_4_ = 0x80000000;
    auVar53._0_8_ = 0x8000000080000000;
    auVar53._12_4_ = 0x80000000;
    auVar51._0_4_ = auVar40._0_4_ ^ 0x80000000;
    auVar40 = vunpckhps_avx(auVar44,auVar36);
    auVar51._4_12_ = auVar7;
    auVar20 = vshufps_avx(auVar40,auVar51,0x41);
    auVar48._0_8_ = auVar18._0_8_ ^ 0x8000000080000000;
    auVar48._8_8_ = auVar53._8_8_ ^ auVar18._8_8_;
    auVar19 = vinsertps_avx(auVar48,auVar44,0x2a);
    auVar40 = vdpps_avx(auVar20,auVar20,0x7f);
    auVar18 = vdpps_avx(auVar19,auVar19,0x7f);
    uVar5 = vcmpps_avx512vl(auVar18,auVar40,1);
    auVar40 = vpmovm2d_avx512vl(uVar5);
    auVar54._0_4_ = auVar40._0_4_;
    auVar54._4_4_ = auVar54._0_4_;
    auVar54._8_4_ = auVar54._0_4_;
    auVar54._12_4_ = auVar54._0_4_;
    uVar16 = vpmovd2m_avx512vl(auVar54);
    auVar40 = vpcmpeqd_avx(auVar54,auVar54);
    auVar18._4_4_ = (uint)((byte)(uVar16 >> 1) & 1) * auVar40._4_4_;
    auVar18._0_4_ = (uint)((byte)uVar16 & 1) * auVar40._0_4_;
    auVar18._8_4_ = (uint)((byte)(uVar16 >> 2) & 1) * auVar40._8_4_;
    auVar18._12_4_ = (uint)((byte)(uVar16 >> 3) & 1) * auVar40._12_4_;
    auVar40 = vblendvps_avx(auVar19,auVar20,auVar18);
    auVar18 = vdpps_avx(auVar40,auVar40,0x7f);
    auVar55._4_12_ = auVar7;
    auVar55._0_4_ = auVar18._0_4_;
    auVar19 = vrsqrt14ss_avx512f(auVar36,auVar55);
    fVar42 = auVar19._0_4_;
    fVar42 = fVar42 * 1.5 - auVar18._0_4_ * 0.5 * fVar42 * fVar42 * fVar42;
    auVar49._0_4_ = fVar42 * auVar40._0_4_;
    auVar49._4_4_ = fVar42 * auVar40._4_4_;
    auVar49._8_4_ = fVar42 * auVar40._8_4_;
    auVar49._12_4_ = fVar42 * auVar40._12_4_;
    auVar40 = vshufps_avx(auVar49,auVar49,0xc9);
    auVar18 = vshufps_avx(auVar44,auVar44,0xc9);
    auVar56._0_4_ = auVar18._0_4_ * auVar49._0_4_;
    auVar56._4_4_ = auVar18._4_4_ * auVar49._4_4_;
    auVar56._8_4_ = auVar18._8_4_ * auVar49._8_4_;
    auVar56._12_4_ = auVar18._12_4_ * auVar49._12_4_;
    auVar40 = vfmsub231ps_fma(auVar56,auVar44,auVar40);
    auVar18 = vshufps_avx(auVar40,auVar40,0xc9);
    auVar40 = vdpps_avx(auVar18,auVar18,0x7f);
    auVar19._4_12_ = auVar7;
    auVar19._0_4_ = auVar40._0_4_;
    auVar19 = vrsqrt14ss_avx512f(auVar36,auVar19);
    fVar42 = auVar19._0_4_;
    fVar42 = fVar42 * 1.5 - auVar40._0_4_ * 0.5 * fVar42 * fVar42 * fVar42;
    auVar38._0_4_ = auVar18._0_4_ * fVar42;
    auVar38._4_4_ = auVar18._4_4_ * fVar42;
    auVar38._8_4_ = auVar18._8_4_ * fVar42;
    auVar38._12_4_ = auVar18._12_4_ * fVar42;
    auVar40._0_4_ = local_2578[0] * auVar44._0_4_;
    auVar40._4_4_ = local_2578[0] * auVar44._4_4_;
    auVar40._8_4_ = local_2578[0] * auVar44._8_4_;
    auVar40._12_4_ = local_2578[0] * auVar44._12_4_;
    auVar19 = vunpcklps_avx(auVar49,auVar40);
    auVar40 = vunpckhps_avx(auVar49,auVar40);
    auVar20 = vunpcklps_avx(auVar38,auVar36);
    auVar18 = vunpckhps_avx(auVar38,auVar36);
    local_2548 = vunpcklps_avx(auVar40,auVar18);
    local_2568 = vunpcklps_avx(auVar19,auVar20);
    local_2558 = vunpckhps_avx(auVar19,auVar20);
    local_2378 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
    local_2370 = 0;
    if (local_2378 != 8) {
      auVar40 = vmaxss_avx(ZEXT816(0) << 0x20,
                           ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
      auVar18 = vmaxss_avx(ZEXT816(0) << 0x20,ZEXT416((uint)(ray->super_RayK<1>).tfar));
      puVar13 = local_2368;
      auVar36._8_4_ = 0x7fffffff;
      auVar36._0_8_ = 0x7fffffff7fffffff;
      auVar36._12_4_ = 0x7fffffff;
      auVar19 = vandps_avx512vl((undefined1  [16])aVar2,auVar36);
      auVar45._8_4_ = 0x219392ef;
      auVar45._0_8_ = 0x219392ef219392ef;
      auVar45._12_4_ = 0x219392ef;
      uVar16 = vcmpps_avx512vl(auVar19,auVar45,1);
      auVar20 = vblendmps_avx512vl((undefined1  [16])aVar2,auVar45);
      bVar3 = (bool)((byte)uVar16 & 1);
      auVar21._0_4_ = (uint)bVar3 * auVar20._0_4_ | (uint)!bVar3 * auVar19._0_4_;
      bVar3 = (bool)((byte)(uVar16 >> 1) & 1);
      auVar21._4_4_ = (uint)bVar3 * auVar20._4_4_ | (uint)!bVar3 * auVar19._4_4_;
      bVar3 = (bool)((byte)(uVar16 >> 2) & 1);
      auVar21._8_4_ = (uint)bVar3 * auVar20._8_4_ | (uint)!bVar3 * auVar19._8_4_;
      bVar3 = (bool)((byte)(uVar16 >> 3) & 1);
      auVar21._12_4_ = (uint)bVar3 * auVar20._12_4_ | (uint)!bVar3 * auVar19._12_4_;
      auVar19 = vrcp14ps_avx512vl(auVar21);
      auVar6._8_4_ = 0x3f800000;
      auVar6._0_8_ = &DAT_3f8000003f800000;
      auVar6._12_4_ = 0x3f800000;
      auVar20 = vfnmadd213ps_avx512vl(auVar21,auVar19,auVar6);
      local_2498 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
      auVar36 = vfmadd132ps_fma(auVar20,auVar19,auVar19);
      local_24b8 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
      local_24d8 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
      auVar22._8_4_ = 1;
      auVar22._0_8_ = 0x100000001;
      auVar22._12_4_ = 1;
      auVar22._16_4_ = 1;
      auVar22._20_4_ = 1;
      auVar22._24_4_ = 1;
      auVar22._28_4_ = 1;
      local_2518 = vpermps_avx2(auVar22,ZEXT1632((undefined1  [16])aVar2));
      auVar25._8_4_ = 2;
      auVar25._0_8_ = 0x200000002;
      auVar25._12_4_ = 2;
      auVar25._16_4_ = 2;
      auVar25._20_4_ = 2;
      auVar25._24_4_ = 2;
      auVar25._28_4_ = 2;
      _local_2538 = vpermps_avx2(auVar25,ZEXT1632((undefined1  [16])aVar2));
      local_23b8 = vbroadcastss_avx512vl(auVar36);
      auVar60 = ZEXT3264(local_23b8);
      auVar19 = vmovshdup_avx(auVar36);
      local_23d8 = vbroadcastsd_avx512vl(auVar19);
      auVar61 = ZEXT3264(local_23d8);
      auVar20 = vshufpd_avx(auVar36,auVar36,1);
      local_23f8 = vpermps_avx512vl(auVar25,ZEXT1632(auVar36));
      auVar62 = ZEXT3264(local_23f8);
      fVar42 = auVar36._0_4_ * (ray->super_RayK<1>).org.field_0.m128[0];
      auVar50._4_4_ = fVar42;
      auVar50._0_4_ = fVar42;
      auVar50._8_4_ = fVar42;
      auVar50._12_4_ = fVar42;
      auVar50._16_4_ = fVar42;
      auVar50._20_4_ = fVar42;
      auVar50._24_4_ = fVar42;
      auVar50._28_4_ = fVar42;
      auVar23 = ZEXT1632(CONCAT412(auVar36._12_4_ * (ray->super_RayK<1>).org.field_0.m128[3],
                                   CONCAT48(auVar36._8_4_ * (ray->super_RayK<1>).org.field_0.m128[2]
                                            ,CONCAT44(auVar36._4_4_ *
                                                      (ray->super_RayK<1>).org.field_0.m128[1],
                                                      fVar42))));
      auVar22 = vpermps_avx2(auVar22,auVar23);
      auVar52 = ZEXT3264(auVar22);
      auVar23 = vpermps_avx2(auVar25,auVar23);
      uVar12 = (ulong)(auVar36._0_4_ < 0.0) * 0x20;
      uVar16 = (ulong)(auVar19._0_4_ < 0.0) << 5 | 0x40;
      uVar14 = (ulong)(auVar20._0_4_ < 0.0) << 5 | 0x80;
      local_2418 = vbroadcastss_avx512vl(auVar40);
      auVar63 = ZEXT3264(local_2418);
      auVar24._8_4_ = 0x80000000;
      auVar24._0_8_ = 0x8000000080000000;
      auVar24._12_4_ = 0x80000000;
      auVar24._16_4_ = 0x80000000;
      auVar24._20_4_ = 0x80000000;
      auVar24._24_4_ = 0x80000000;
      auVar24._28_4_ = 0x80000000;
      uVar35 = auVar18._0_4_;
      auVar34 = ZEXT3264(CONCAT428(uVar35,CONCAT424(uVar35,CONCAT420(uVar35,CONCAT416(uVar35,
                                                  CONCAT412(uVar35,CONCAT48(uVar35,CONCAT44(uVar35,
                                                  uVar35))))))));
      local_2438 = vxorps_avx512vl(auVar50,auVar24);
      auVar64 = ZEXT3264(local_2438);
      local_2458 = vxorps_avx512vl(auVar22,auVar24);
      auVar65 = ZEXT3264(local_2458);
      local_2478 = vxorps_avx512vl(auVar23,auVar24);
      auVar66 = ZEXT3264(local_2478);
      auVar22 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
      auVar67 = ZEXT3264(auVar22);
      auVar22 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
      auVar68 = ZEXT3264(auVar22);
      fStack_24f4 = local_24f8;
      fStack_24f0 = local_24f8;
      fStack_24ec = local_24f8;
      fStack_24e8 = local_24f8;
      fStack_24e4 = local_24f8;
      fStack_24e0 = local_24f8;
      fStack_24dc = local_24f8;
      uStack_24d4 = local_24d8;
      uStack_24d0 = local_24d8;
      uStack_24cc = local_24d8;
      uStack_24c8 = local_24d8;
      uStack_24c4 = local_24d8;
      uStack_24c0 = local_24d8;
      uStack_24bc = local_24d8;
      uStack_24b4 = local_24b8;
      uStack_24b0 = local_24b8;
      uStack_24ac = local_24b8;
      uStack_24a8 = local_24b8;
      uStack_24a4 = local_24b8;
      uStack_24a0 = local_24b8;
      uStack_249c = local_24b8;
      uStack_2494 = local_2498;
      uStack_2490 = local_2498;
      uStack_248c = local_2498;
      uStack_2488 = local_2498;
      uStack_2484 = local_2498;
      uStack_2480 = local_2498;
      uStack_247c = local_2498;
      do {
        fVar42 = (ray->super_RayK<1>).tfar;
        auVar37 = ZEXT464((uint)fVar42);
        do {
          if (puVar13 == &local_2378) {
            return;
          }
          pfVar1 = (float *)(puVar13 + -1);
          auVar39 = ZEXT464((uint)*pfVar1);
          puVar13 = puVar13 + -2;
        } while (fVar42 < *pfVar1);
        uVar17 = *puVar13;
        do {
          if ((uVar17 & 0xf) == 0) {
            auVar22 = vfmadd132ps_avx512vl
                                (*(undefined1 (*) [32])(uVar17 + 0x40 + uVar12),auVar64._0_32_,
                                 auVar60._0_32_);
            auVar23 = vfmadd132ps_avx512vl
                                (*(undefined1 (*) [32])(uVar17 + 0x40 + uVar16),auVar65._0_32_,
                                 auVar61._0_32_);
            auVar22 = vpmaxsd_avx2(auVar22,auVar23);
            auVar23 = vfmadd132ps_avx512vl
                                (*(undefined1 (*) [32])(uVar17 + 0x40 + uVar14),auVar66._0_32_,
                                 auVar62._0_32_);
            auVar24 = vfmadd132ps_avx512vl
                                (*(undefined1 (*) [32])(uVar17 + 0x40 + (uVar12 ^ 0x20)),
                                 auVar64._0_32_,auVar60._0_32_);
            auVar25 = vfmadd132ps_avx512vl
                                (*(undefined1 (*) [32])(uVar17 + 0x40 + (uVar16 ^ 0x20)),
                                 auVar65._0_32_,auVar61._0_32_);
            auVar24 = vpminsd_avx2(auVar24,auVar25);
            auVar25 = vfmadd132ps_avx512vl
                                (*(undefined1 (*) [32])(uVar17 + 0x40 + (uVar14 ^ 0x20)),
                                 auVar66._0_32_,auVar62._0_32_);
            auVar23 = vpmaxsd_avx512vl(auVar23,auVar63._0_32_);
            auVar22 = vpmaxsd_avx2(auVar22,auVar23);
            auVar25 = vpminsd_avx2(auVar25,auVar34._0_32_);
            auVar24 = vpminsd_avx2(auVar24,auVar25);
            uVar5 = vpcmpd_avx512vl(auVar22,auVar24,2);
            bVar15 = (byte)uVar5;
LAB_01fb6d5b:
            auVar52 = ZEXT3264(auVar22);
            auVar39 = ZEXT3264(auVar23);
            auVar37 = ZEXT3264(auVar24);
            unaff_R15 = CONCAT44((int)(unaff_R15 >> 0x20),(uint)bVar15);
            bVar3 = true;
          }
          else {
            if ((int)(uVar17 & 0xf) == 2) {
              uVar9 = uVar17 & 0xfffffffffffffff0;
              auVar22 = *(undefined1 (*) [32])(uVar9 + 0x100);
              auVar52._0_4_ = (float)local_2538._0_4_ * auVar22._0_4_;
              auVar52._4_4_ = (float)local_2538._4_4_ * auVar22._4_4_;
              auVar52._8_4_ = fStack_2530 * auVar22._8_4_;
              auVar52._12_4_ = fStack_252c * auVar22._12_4_;
              auVar52._16_4_ = fStack_2528 * auVar22._16_4_;
              auVar52._20_4_ = fStack_2524 * auVar22._20_4_;
              auVar52._28_36_ = auVar37._28_36_;
              auVar52._24_4_ = fStack_2520 * auVar22._24_4_;
              auVar23 = *(undefined1 (*) [32])(uVar9 + 0x120);
              auVar37._0_4_ = (float)local_2538._0_4_ * auVar23._0_4_;
              auVar37._4_4_ = (float)local_2538._4_4_ * auVar23._4_4_;
              auVar37._8_4_ = fStack_2530 * auVar23._8_4_;
              auVar37._12_4_ = fStack_252c * auVar23._12_4_;
              auVar37._16_4_ = fStack_2528 * auVar23._16_4_;
              auVar37._20_4_ = fStack_2524 * auVar23._20_4_;
              auVar37._28_36_ = auVar39._28_36_;
              auVar37._24_4_ = fStack_2520 * auVar23._24_4_;
              auVar24 = *(undefined1 (*) [32])(uVar9 + 0x140);
              auVar32._4_4_ = (float)local_2538._4_4_ * auVar24._4_4_;
              auVar32._0_4_ = (float)local_2538._0_4_ * auVar24._0_4_;
              auVar32._8_4_ = fStack_2530 * auVar24._8_4_;
              auVar32._12_4_ = fStack_252c * auVar24._12_4_;
              auVar32._16_4_ = fStack_2528 * auVar24._16_4_;
              auVar32._20_4_ = fStack_2524 * auVar24._20_4_;
              auVar32._24_4_ = fStack_2520 * auVar24._24_4_;
              auVar32._28_4_ = uStack_251c;
              auVar40 = vfmadd231ps_fma(auVar52._0_32_,local_2518,
                                        *(undefined1 (*) [32])(uVar9 + 0xa0));
              auVar18 = vfmadd231ps_fma(auVar37._0_32_,local_2518,
                                        *(undefined1 (*) [32])(uVar9 + 0xc0));
              auVar19 = vfmadd231ps_fma(auVar32,local_2518,*(undefined1 (*) [32])(uVar9 + 0xe0));
              auVar4._4_4_ = fStack_24f4;
              auVar4._0_4_ = local_24f8;
              auVar4._8_4_ = fStack_24f0;
              auVar4._12_4_ = fStack_24ec;
              auVar4._16_4_ = fStack_24e8;
              auVar4._20_4_ = fStack_24e4;
              auVar4._24_4_ = fStack_24e0;
              auVar4._28_4_ = fStack_24dc;
              auVar40 = vfmadd231ps_fma(ZEXT1632(auVar40),auVar4,
                                        *(undefined1 (*) [32])(uVar9 + 0x40));
              auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar4,
                                        *(undefined1 (*) [32])(uVar9 + 0x60));
              auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar4,
                                        *(undefined1 (*) [32])(uVar9 + 0x80));
              auVar57._8_4_ = 0x7fffffff;
              auVar57._0_8_ = 0x7fffffff7fffffff;
              auVar57._12_4_ = 0x7fffffff;
              auVar57._16_4_ = 0x7fffffff;
              auVar57._20_4_ = 0x7fffffff;
              auVar57._24_4_ = 0x7fffffff;
              auVar57._28_4_ = 0x7fffffff;
              auVar25 = vandps_avx(auVar57,ZEXT1632(auVar40));
              auVar59._8_4_ = 0x219392ef;
              auVar59._0_8_ = 0x219392ef219392ef;
              auVar59._12_4_ = 0x219392ef;
              auVar59._16_4_ = 0x219392ef;
              auVar59._20_4_ = 0x219392ef;
              auVar59._24_4_ = 0x219392ef;
              auVar59._28_4_ = 0x219392ef;
              uVar11 = vcmpps_avx512vl(auVar25,auVar59,1);
              bVar3 = (bool)((byte)uVar11 & 1);
              auVar27._0_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar40._0_4_;
              bVar3 = (bool)((byte)(uVar11 >> 1) & 1);
              auVar27._4_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar40._4_4_;
              bVar3 = (bool)((byte)(uVar11 >> 2) & 1);
              auVar27._8_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar40._8_4_;
              bVar3 = (bool)((byte)(uVar11 >> 3) & 1);
              auVar27._12_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar40._12_4_;
              auVar27._16_4_ = (uint)((byte)(uVar11 >> 4) & 1) * 0x219392ef;
              auVar27._20_4_ = (uint)((byte)(uVar11 >> 5) & 1) * 0x219392ef;
              auVar27._24_4_ = (uint)((byte)(uVar11 >> 6) & 1) * 0x219392ef;
              auVar27._28_4_ = (uint)(byte)(uVar11 >> 7) * 0x219392ef;
              auVar25 = vandps_avx(auVar57,ZEXT1632(auVar18));
              uVar11 = vcmpps_avx512vl(auVar25,auVar59,1);
              bVar3 = (bool)((byte)uVar11 & 1);
              auVar28._0_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar18._0_4_;
              bVar3 = (bool)((byte)(uVar11 >> 1) & 1);
              auVar28._4_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar18._4_4_;
              bVar3 = (bool)((byte)(uVar11 >> 2) & 1);
              auVar28._8_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar18._8_4_;
              bVar3 = (bool)((byte)(uVar11 >> 3) & 1);
              auVar28._12_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar18._12_4_;
              auVar28._16_4_ = (uint)((byte)(uVar11 >> 4) & 1) * 0x219392ef;
              auVar28._20_4_ = (uint)((byte)(uVar11 >> 5) & 1) * 0x219392ef;
              auVar28._24_4_ = (uint)((byte)(uVar11 >> 6) & 1) * 0x219392ef;
              auVar28._28_4_ = (uint)(byte)(uVar11 >> 7) * 0x219392ef;
              auVar25 = vandps_avx(auVar57,ZEXT1632(auVar19));
              uVar11 = vcmpps_avx512vl(auVar25,auVar59,1);
              bVar3 = (bool)((byte)uVar11 & 1);
              auVar29._0_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar19._0_4_;
              bVar3 = (bool)((byte)(uVar11 >> 1) & 1);
              auVar29._4_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar19._4_4_;
              bVar3 = (bool)((byte)(uVar11 >> 2) & 1);
              auVar29._8_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar19._8_4_;
              bVar3 = (bool)((byte)(uVar11 >> 3) & 1);
              auVar29._12_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar19._12_4_;
              auVar29._16_4_ = (uint)((byte)(uVar11 >> 4) & 1) * 0x219392ef;
              auVar29._20_4_ = (uint)((byte)(uVar11 >> 5) & 1) * 0x219392ef;
              auVar29._24_4_ = (uint)((byte)(uVar11 >> 6) & 1) * 0x219392ef;
              auVar29._28_4_ = (uint)(byte)(uVar11 >> 7) * 0x219392ef;
              auVar25 = vrcp14ps_avx512vl(auVar27);
              auVar58._8_4_ = 0x3f800000;
              auVar58._0_8_ = &DAT_3f8000003f800000;
              auVar58._12_4_ = 0x3f800000;
              auVar58._16_4_ = 0x3f800000;
              auVar58._20_4_ = 0x3f800000;
              auVar58._24_4_ = 0x3f800000;
              auVar58._28_4_ = 0x3f800000;
              auVar40 = vfnmadd213ps_fma(auVar27,auVar25,auVar58);
              auVar40 = vfmadd132ps_fma(ZEXT1632(auVar40),auVar25,auVar25);
              auVar25 = vrcp14ps_avx512vl(auVar28);
              auVar18 = vfnmadd213ps_fma(auVar28,auVar25,auVar58);
              auVar18 = vfmadd132ps_fma(ZEXT1632(auVar18),auVar25,auVar25);
              auVar25 = vrcp14ps_avx512vl(auVar29);
              auVar19 = vfnmadd213ps_fma(auVar29,auVar25,auVar58);
              auVar19 = vfmadd132ps_fma(ZEXT1632(auVar19),auVar25,auVar25);
              auVar31._4_4_ = uStack_24d4;
              auVar31._0_4_ = local_24d8;
              auVar31._8_4_ = uStack_24d0;
              auVar31._12_4_ = uStack_24cc;
              auVar31._16_4_ = uStack_24c8;
              auVar31._20_4_ = uStack_24c4;
              auVar31._24_4_ = uStack_24c0;
              auVar31._28_4_ = uStack_24bc;
              auVar22 = vfmadd213ps_avx512vl(auVar22,auVar31,*(undefined1 (*) [32])(uVar9 + 0x160));
              auVar25 = vfmadd213ps_avx512vl(auVar23,auVar31,*(undefined1 (*) [32])(uVar9 + 0x180));
              auVar24 = vfmadd213ps_avx512vl(auVar24,auVar31,*(undefined1 (*) [32])(uVar9 + 0x1a0));
              auVar23._4_4_ = uStack_24b4;
              auVar23._0_4_ = local_24b8;
              auVar23._8_4_ = uStack_24b0;
              auVar23._12_4_ = uStack_24ac;
              auVar23._16_4_ = uStack_24a8;
              auVar23._20_4_ = uStack_24a4;
              auVar23._24_4_ = uStack_24a0;
              auVar23._28_4_ = uStack_249c;
              auVar22 = vfmadd231ps_avx512vl(auVar22,auVar23,*(undefined1 (*) [32])(uVar9 + 0xa0));
              auVar25 = vfmadd231ps_avx512vl(auVar25,auVar23,*(undefined1 (*) [32])(uVar9 + 0xc0));
              auVar23 = vfmadd231ps_avx512vl(auVar24,auVar23,*(undefined1 (*) [32])(uVar9 + 0xe0));
              auVar30._4_4_ = uStack_2494;
              auVar30._0_4_ = local_2498;
              auVar30._8_4_ = uStack_2490;
              auVar30._12_4_ = uStack_248c;
              auVar30._16_4_ = uStack_2488;
              auVar30._20_4_ = uStack_2484;
              auVar30._24_4_ = uStack_2480;
              auVar30._28_4_ = uStack_247c;
              auVar20 = vfmadd231ps_fma(auVar22,auVar30,*(undefined1 (*) [32])(uVar9 + 0x40));
              auVar47._0_4_ = -auVar40._0_4_ * auVar20._0_4_;
              auVar47._4_4_ = -auVar40._4_4_ * auVar20._4_4_;
              auVar47._8_4_ = -auVar40._8_4_ * auVar20._8_4_;
              auVar47._12_4_ = -auVar40._12_4_ * auVar20._12_4_;
              auVar47._16_4_ = 0x80000000;
              auVar47._20_4_ = 0x80000000;
              auVar47._24_4_ = 0x80000000;
              auVar47._28_4_ = 0;
              auVar20 = vfmadd231ps_fma(auVar25,auVar30,*(undefined1 (*) [32])(uVar9 + 0x60));
              auVar46._0_4_ = -auVar18._0_4_ * auVar20._0_4_;
              auVar46._4_4_ = -auVar18._4_4_ * auVar20._4_4_;
              auVar46._8_4_ = -auVar18._8_4_ * auVar20._8_4_;
              auVar46._12_4_ = -auVar18._12_4_ * auVar20._12_4_;
              auVar46._16_4_ = 0x80000000;
              auVar46._20_4_ = 0x80000000;
              auVar46._24_4_ = 0x80000000;
              auVar46._28_4_ = 0;
              auVar20 = vfmadd231ps_fma(auVar23,auVar30,*(undefined1 (*) [32])(uVar9 + 0x80));
              auVar43._0_4_ = -auVar19._0_4_ * auVar20._0_4_;
              auVar43._4_4_ = -auVar19._4_4_ * auVar20._4_4_;
              auVar43._8_4_ = -auVar19._8_4_ * auVar20._8_4_;
              auVar43._12_4_ = -auVar19._12_4_ * auVar20._12_4_;
              auVar43._16_4_ = 0x80000000;
              auVar43._20_4_ = 0x80000000;
              auVar43._24_4_ = 0x80000000;
              auVar43._28_4_ = 0;
              auVar24 = ZEXT1632(CONCAT412(auVar40._12_4_ + auVar47._12_4_,
                                           CONCAT48(auVar40._8_4_ + auVar47._8_4_,
                                                    CONCAT44(auVar40._4_4_ + auVar47._4_4_,
                                                             auVar40._0_4_ + auVar47._0_4_))));
              auVar25 = ZEXT1632(CONCAT412(auVar18._12_4_ + auVar46._12_4_,
                                           CONCAT48(auVar18._8_4_ + auVar46._8_4_,
                                                    CONCAT44(auVar18._4_4_ + auVar46._4_4_,
                                                             auVar18._0_4_ + auVar46._0_4_))));
              auVar32 = ZEXT1632(CONCAT412(auVar19._12_4_ + auVar43._12_4_,
                                           CONCAT48(auVar19._8_4_ + auVar43._8_4_,
                                                    CONCAT44(auVar19._4_4_ + auVar43._4_4_,
                                                             auVar19._0_4_ + auVar43._0_4_))));
              auVar50 = vpminsd_avx2(auVar47,auVar24);
              auVar22 = vpminsd_avx2(auVar46,auVar25);
              auVar23 = vpminsd_avx2(auVar43,auVar32);
              auVar22 = vmaxps_avx(auVar22,auVar23);
              auVar24 = vpmaxsd_avx2(auVar47,auVar24);
              auVar23 = vpmaxsd_avx2(auVar46,auVar25);
              auVar25 = vpmaxsd_avx2(auVar43,auVar32);
              auVar23 = vminps_avx(auVar23,auVar25);
              auVar25 = vmaxps_avx512vl(auVar63._0_32_,auVar50);
              auVar22 = vmaxps_avx(auVar25,auVar22);
              auVar24 = vminps_avx(auVar34._0_32_,auVar24);
              auVar24 = vminps_avx(auVar24,auVar23);
              uVar5 = vcmpps_avx512vl(auVar22,auVar24,2);
              bVar15 = (byte)uVar5;
              goto LAB_01fb6d5b;
            }
            bVar3 = false;
          }
          if (bVar3) {
            if (unaff_R15 == 0) {
              iVar8 = 4;
            }
            else {
              auVar22 = *(undefined1 (*) [32])(uVar17 & 0xfffffffffffffff0);
              auVar37 = ZEXT3264(auVar22);
              auVar23 = ((undefined1 (*) [32])(uVar17 & 0xfffffffffffffff0))[1];
              auVar39 = ZEXT3264(auVar23);
              auVar24 = vmovdqa64_avx512vl(auVar67._0_32_);
              auVar50 = auVar52._0_32_;
              auVar24 = vpternlogd_avx512vl(auVar24,auVar50,auVar68._0_32_,0xf8);
              uVar17 = unaff_R15 & 0xffffffff;
              auVar25 = vpcompressd_avx512vl(auVar24);
              bVar3 = (bool)((byte)uVar17 & 1);
              auVar26._0_4_ = (uint)bVar3 * auVar25._0_4_ | (uint)!bVar3 * auVar24._0_4_;
              bVar3 = (bool)((byte)(uVar17 >> 1) & 1);
              auVar26._4_4_ = (uint)bVar3 * auVar25._4_4_ | (uint)!bVar3 * auVar24._4_4_;
              bVar3 = (bool)((byte)(uVar17 >> 2) & 1);
              auVar26._8_4_ = (uint)bVar3 * auVar25._8_4_ | (uint)!bVar3 * auVar24._8_4_;
              bVar3 = (bool)((byte)(uVar17 >> 3) & 1);
              auVar26._12_4_ = (uint)bVar3 * auVar25._12_4_ | (uint)!bVar3 * auVar24._12_4_;
              bVar3 = (bool)((byte)(uVar17 >> 4) & 1);
              auVar26._16_4_ = (uint)bVar3 * auVar25._16_4_ | (uint)!bVar3 * auVar24._16_4_;
              bVar3 = (bool)((byte)(uVar17 >> 5) & 1);
              auVar26._20_4_ = (uint)bVar3 * auVar25._20_4_ | (uint)!bVar3 * auVar24._20_4_;
              bVar3 = (bool)((byte)(uVar17 >> 6) & 1);
              auVar26._24_4_ = (uint)bVar3 * auVar25._24_4_ | (uint)!bVar3 * auVar24._24_4_;
              bVar3 = (bool)((byte)(uVar17 >> 7) & 1);
              auVar26._28_4_ = (uint)bVar3 * auVar25._28_4_ | (uint)!bVar3 * auVar24._28_4_;
              auVar24 = vpermt2q_avx512vl(auVar22,auVar26,auVar23);
              uVar17 = auVar24._0_8_;
              iVar8 = 0;
              uVar11 = unaff_R15 - 1 & unaff_R15;
              if (uVar11 != 0) {
                auVar24 = vpshufd_avx2(auVar26,0x55);
                vpermt2q_avx512vl(auVar22,auVar24,auVar23);
                auVar25 = vpminsd_avx2(auVar26,auVar24);
                auVar24 = vpmaxsd_avx2(auVar26,auVar24);
                uVar11 = uVar11 - 1 & uVar11;
                if (uVar11 == 0) {
                  auVar25 = vpermi2q_avx512vl(auVar25,auVar22,auVar23);
                  uVar17 = auVar25._0_8_;
                  auVar22 = vpermt2q_avx512vl(auVar22,auVar24,auVar23);
                  *puVar13 = auVar22._0_8_;
                  auVar22 = vpermd_avx2(auVar24,auVar50);
                  auVar37 = ZEXT3264(auVar22);
                  *(int *)(puVar13 + 1) = auVar22._0_4_;
                  puVar13 = puVar13 + 2;
                }
                else {
                  auVar4 = vpshufd_avx2(auVar26,0xaa);
                  vpermt2q_avx512vl(auVar22,auVar4,auVar23);
                  auVar32 = vpminsd_avx2(auVar25,auVar4);
                  auVar25 = vpmaxsd_avx2(auVar25,auVar4);
                  auVar4 = vpminsd_avx2(auVar24,auVar25);
                  auVar24 = vpmaxsd_avx2(auVar24,auVar25);
                  uVar11 = uVar11 - 1 & uVar11;
                  if (uVar11 == 0) {
                    auVar25 = vpermi2q_avx512vl(auVar32,auVar22,auVar23);
                    uVar17 = auVar25._0_8_;
                    auVar25 = vpermt2q_avx512vl(auVar22,auVar24,auVar23);
                    *puVar13 = auVar25._0_8_;
                    auVar24 = vpermd_avx2(auVar24,auVar50);
                    *(int *)(puVar13 + 1) = auVar24._0_4_;
                    auVar22 = vpermt2q_avx512vl(auVar22,auVar4,auVar23);
                    puVar13[2] = auVar22._0_8_;
                    auVar22 = vpermd_avx2(auVar4,auVar50);
                    auVar37 = ZEXT3264(auVar22);
                    *(int *)(puVar13 + 3) = auVar22._0_4_;
                    puVar13 = puVar13 + 4;
                  }
                  else {
                    auVar25 = vpshufd_avx2(auVar26,0xff);
                    vpermt2q_avx512vl(auVar22,auVar25,auVar23);
                    auVar31 = vpminsd_avx2(auVar32,auVar25);
                    auVar25 = vpmaxsd_avx2(auVar32,auVar25);
                    auVar32 = vpminsd_avx2(auVar4,auVar25);
                    auVar25 = vpmaxsd_avx2(auVar4,auVar25);
                    auVar4 = vpminsd_avx2(auVar24,auVar25);
                    auVar24 = vpmaxsd_avx2(auVar24,auVar25);
                    uVar11 = uVar11 - 1 & uVar11;
                    if (uVar11 == 0) {
                      auVar25 = vpermi2q_avx512vl(auVar31,auVar22,auVar23);
                      uVar17 = auVar25._0_8_;
                      auVar25 = vpermt2q_avx512vl(auVar22,auVar24,auVar23);
                      *puVar13 = auVar25._0_8_;
                      auVar52 = ZEXT3264(auVar50);
                      auVar24 = vpermd_avx2(auVar24,auVar50);
                      *(int *)(puVar13 + 1) = auVar24._0_4_;
                      auVar24 = vpermt2q_avx512vl(auVar22,auVar4,auVar23);
                      puVar13[2] = auVar24._0_8_;
                      auVar24 = vpermd_avx2(auVar4,auVar50);
                      *(int *)(puVar13 + 3) = auVar24._0_4_;
                      auVar22 = vpermt2q_avx512vl(auVar22,auVar32,auVar23);
                      puVar13[4] = auVar22._0_8_;
                      auVar22 = vpermd_avx2(auVar32,auVar50);
                      auVar37 = ZEXT3264(auVar22);
                      *(int *)(puVar13 + 5) = auVar22._0_4_;
                      puVar13 = puVar13 + 6;
                    }
                    else {
                      auVar30 = valignd_avx512vl(auVar26,auVar26,3);
                      auVar25 = vpmovsxbd_avx2(ZEXT816(0x303020108));
                      auVar31 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                                     CONCAT48(0x80000000,
                                                                              0x8000000080000000))),
                                                  auVar25,auVar31);
                      auVar25 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
                      auVar32 = vpermt2d_avx512vl(auVar31,auVar25,auVar32);
                      auVar32 = vpermt2d_avx512vl(auVar32,auVar25,auVar4);
                      auVar25 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                      auVar24 = vpermt2d_avx512vl(auVar32,auVar25,auVar24);
                      auVar52 = ZEXT3264(auVar24);
                      uVar17 = uVar11;
                      do {
                        auVar25 = auVar52._0_32_;
                        auVar41._8_4_ = 1;
                        auVar41._0_8_ = 0x100000001;
                        auVar41._12_4_ = 1;
                        auVar41._16_4_ = 1;
                        auVar41._20_4_ = 1;
                        auVar41._24_4_ = 1;
                        auVar41._28_4_ = 1;
                        auVar24 = vpermd_avx2(auVar41,auVar30);
                        auVar30 = valignd_avx512vl(auVar30,auVar30,1);
                        vpermt2q_avx512vl(auVar22,auVar30,auVar23);
                        uVar17 = uVar17 - 1 & uVar17;
                        uVar5 = vpcmpd_avx512vl(auVar24,auVar25,5);
                        auVar24 = vpmaxsd_avx2(auVar24,auVar25);
                        bVar15 = (byte)uVar5 << 1;
                        auVar25 = valignd_avx512vl(auVar25,auVar25,7);
                        bVar3 = (bool)((byte)uVar5 & 1);
                        auVar33._4_4_ = (uint)bVar3 * auVar25._4_4_ | (uint)!bVar3 * auVar24._4_4_;
                        auVar33._0_4_ = auVar24._0_4_;
                        bVar3 = (bool)(bVar15 >> 2 & 1);
                        auVar33._8_4_ = (uint)bVar3 * auVar25._8_4_ | (uint)!bVar3 * auVar24._8_4_;
                        bVar3 = (bool)(bVar15 >> 3 & 1);
                        auVar33._12_4_ =
                             (uint)bVar3 * auVar25._12_4_ | (uint)!bVar3 * auVar24._12_4_;
                        bVar3 = (bool)(bVar15 >> 4 & 1);
                        auVar33._16_4_ =
                             (uint)bVar3 * auVar25._16_4_ | (uint)!bVar3 * auVar24._16_4_;
                        bVar3 = (bool)(bVar15 >> 5 & 1);
                        auVar33._20_4_ =
                             (uint)bVar3 * auVar25._20_4_ | (uint)!bVar3 * auVar24._20_4_;
                        bVar3 = (bool)(bVar15 >> 6 & 1);
                        auVar33._24_4_ =
                             (uint)bVar3 * auVar25._24_4_ | (uint)!bVar3 * auVar24._24_4_;
                        auVar33._28_4_ =
                             (uint)(bVar15 >> 7) * auVar25._28_4_ |
                             (uint)!(bool)(bVar15 >> 7) * auVar24._28_4_;
                        auVar52 = ZEXT3264(auVar33);
                      } while (uVar17 != 0);
                      lVar10 = POPCOUNT(uVar11) + 3;
                      do {
                        auVar24 = vpermi2q_avx512vl(auVar33,auVar22,auVar23);
                        *puVar13 = auVar24._0_8_;
                        auVar25 = auVar52._0_32_;
                        auVar24 = vpermd_avx2(auVar25,auVar50);
                        *(int *)(puVar13 + 1) = auVar24._0_4_;
                        auVar33 = valignd_avx512vl(auVar25,auVar25,1);
                        puVar13 = puVar13 + 2;
                        auVar52 = ZEXT3264(auVar33);
                        lVar10 = lVar10 + -1;
                      } while (lVar10 != 0);
                      auVar22 = vpermt2q_avx512vl(auVar22,auVar33,auVar23);
                      auVar37 = ZEXT3264(auVar22);
                      uVar17 = auVar22._0_8_;
                      auVar52 = ZEXT3264(auVar50);
                    }
                  }
                }
              }
            }
          }
          else {
            iVar8 = 6;
          }
        } while (iVar8 == 0);
        if (iVar8 == 6) {
          local_2398 = auVar52._0_32_;
          (**(code **)((long)This->leafIntersector +
                      (ulong)*(byte *)(uVar17 & 0xfffffffffffffff0) * 0x40))(local_2578,ray,context)
          ;
          auVar52 = ZEXT3264(local_2398);
          auVar22 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
          auVar68 = ZEXT3264(auVar22);
          auVar22 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
          auVar67 = ZEXT3264(auVar22);
          auVar66 = ZEXT3264(local_2478);
          auVar65 = ZEXT3264(local_2458);
          auVar64 = ZEXT3264(local_2438);
          auVar63 = ZEXT3264(local_2418);
          auVar62 = ZEXT3264(local_23f8);
          auVar61 = ZEXT3264(local_23d8);
          auVar60 = ZEXT3264(local_23b8);
          fVar42 = (ray->super_RayK<1>).tfar;
          auVar34 = ZEXT3264(CONCAT428(fVar42,CONCAT424(fVar42,CONCAT420(fVar42,CONCAT416(fVar42,
                                                  CONCAT412(fVar42,CONCAT48(fVar42,CONCAT44(fVar42,
                                                  fVar42))))))));
        }
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }